

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

void generate_hog(uint8_t *src8,int stride,int rows,int cols,float *hist,int highbd)

{
  int in_R9D;
  int in_stack_00000028;
  int in_stack_0000002c;
  uint8_t *in_stack_00000030;
  
  if (in_R9D == 0) {
    lowbd_generate_hog(in_stack_00000030,in_stack_0000002c,in_stack_00000028,src8._4_4_,
                       (float *)CONCAT44(stride,rows));
  }
  else {
    highbd_generate_hog(in_stack_00000030,in_stack_0000002c,in_stack_00000028,src8._4_4_,
                        (float *)CONCAT44(stride,rows));
  }
  return;
}

Assistant:

static inline void generate_hog(const uint8_t *src8, int stride, int rows,
                                int cols, float *hist, int highbd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (highbd) {
    highbd_generate_hog(src8, stride, rows, cols, hist);
    return;
  }
#else
  (void)highbd;
#endif  // CONFIG_AV1_HIGHBITDEPTH
  lowbd_generate_hog(src8, stride, rows, cols, hist);
}